

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O1

void ggml_vec_dot_f32(int n,float *s,size_t bs,float *x,size_t bx,float *y,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  float *pfVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 local_180 [64];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  uVar2 = n & 0xffffffc0;
  local_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  local_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  local_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  local_180 = ZEXT1664(ZEXT816(0));
  if (0 < (int)uVar2) {
    uVar4 = 0;
    pfVar3 = y;
    pfVar5 = x;
    do {
      lVar6 = 0;
      do {
        auVar8 = vfmadd213ps_avx512f(*(undefined1 (*) [64])((long)pfVar3 + lVar6),
                                     *(undefined1 (*) [64])((long)pfVar5 + lVar6),
                                     *(undefined1 (*) [64])(local_180 + lVar6));
        *(undefined1 (*) [64])(local_180 + lVar6) = auVar8;
        lVar6 = lVar6 + 0x40;
      } while (lVar6 != 0x100);
      uVar4 = uVar4 + 0x40;
      pfVar3 = pfVar3 + 0x40;
      pfVar5 = pfVar5 + 0x40;
    } while (uVar4 < uVar2);
  }
  lVar6 = 0;
  do {
    auVar8 = vaddps_avx512f(*(undefined1 (*) [64])(local_180 + lVar6),
                            *(undefined1 (*) [64])((long)&local_100 + lVar6));
    *(undefined1 (*) [64])(local_180 + lVar6) = auVar8;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 == 0x40);
  auVar8._8_8_ = uStack_138;
  auVar8._0_8_ = local_140;
  auVar8._16_8_ = uStack_130;
  auVar8._24_8_ = uStack_128;
  auVar8._32_8_ = uStack_120;
  auVar8._40_8_ = uStack_118;
  auVar8._48_8_ = uStack_110;
  auVar8._56_8_ = uStack_108;
  auVar8 = vaddps_avx512f(local_180,auVar8);
  auVar7 = vextractf64x4_avx512f(auVar8,1);
  auVar8 = vaddps_avx512f(auVar8,ZEXT3264(auVar7));
  auVar9._0_4_ = auVar8._0_4_ + auVar8._16_4_;
  auVar9._4_4_ = auVar8._4_4_ + auVar8._20_4_;
  auVar9._8_4_ = auVar8._8_4_ + auVar8._24_4_;
  auVar9._12_4_ = auVar8._12_4_ + auVar8._28_4_;
  auVar1 = vshufpd_avx(auVar9,auVar9,1);
  auVar10._0_4_ = auVar9._0_4_ + auVar1._0_4_;
  auVar10._4_4_ = auVar9._4_4_ + auVar1._4_4_;
  auVar10._8_4_ = auVar9._8_4_ + auVar1._8_4_;
  auVar10._12_4_ = auVar9._12_4_ + auVar1._12_4_;
  auVar1 = vhaddps_avx(auVar10,auVar10);
  auVar8 = ZEXT1664(auVar1);
  if (uVar2 != n) {
    lVar6 = (long)(int)uVar2;
    do {
      auVar1 = vfmadd231ss_fma(auVar8._0_16_,ZEXT416((uint)x[lVar6]),ZEXT416((uint)y[lVar6]));
      auVar8 = ZEXT1664(auVar1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < n);
  }
  *s = auVar8._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_f32(int n, float * GGML_RESTRICT s, size_t bs, const float * GGML_RESTRICT x, size_t bx, const float * GGML_RESTRICT y, size_t by, int nrc) {
   assert(nrc == 1);
   GGML_UNUSED(nrc);
   GGML_UNUSED(bx);
   GGML_UNUSED(by);
   GGML_UNUSED(bs);

#if defined(GGML_SIMD)
    float sumf = 0.0f;
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC sum[GGML_F32_ARR] = { GGML_F32_VEC_ZERO };

    GGML_F32_VEC ax[GGML_F32_ARR];
    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ax[j] = GGML_F32_VEC_LOAD(x + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);

            sum[j] = GGML_F32_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F32_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += x[i]*y[i];
    }
#else
    // scalar
    ggml_float sumf = 0.0;
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(x[i]*y[i]);
    }
#endif

    *s = sumf;
}